

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprPopulatePoslists
              (Fts5Config *pConfig,Fts5Expr *pExpr,Fts5PoslistPopulator *aPopulator,int iCol,char *z
              ,int n)

{
  Fts5Colset *pColset_00;
  int iVar1;
  Fts5Colset *pColset;
  Fts5ExprNode *pNode;
  Fts5ExprCtx sCtx;
  int i;
  int n_local;
  char *z_local;
  int iCol_local;
  Fts5PoslistPopulator *aPopulator_local;
  Fts5Expr *pExpr_local;
  Fts5Config *pConfig_local;
  
  sCtx.aPopulator = (Fts5PoslistPopulator *)(((long)iCol << 0x20) + -1);
  sCtx.iOff._0_4_ = 0;
  pNode = (Fts5ExprNode *)pExpr;
  sCtx.pExpr = (Fts5Expr *)aPopulator;
  sCtx.iOff._4_4_ = n;
  do {
    if (pExpr->nPhrase <= (int)sCtx.iOff) {
      iVar1 = sqlite3Fts5Tokenize(pConfig,4,z,sCtx.iOff._4_4_,&pNode,fts5ExprPopulatePoslistsCb);
      return iVar1;
    }
    pColset_00 = pExpr->apExprPhrase[(int)sCtx.iOff]->pNode->pNear->pColset;
    if (pColset_00 == (Fts5Colset *)0x0) {
LAB_00202d08:
      if (aPopulator[(int)sCtx.iOff].bMiss != 0) goto LAB_00202d1d;
      aPopulator[(int)sCtx.iOff].bOk = 1;
    }
    else {
      iVar1 = fts5ExprColsetTest(pColset_00,iCol);
      if (iVar1 != 0) goto LAB_00202d08;
LAB_00202d1d:
      aPopulator[(int)sCtx.iOff].bOk = 0;
    }
    sCtx.iOff._0_4_ = (int)sCtx.iOff + 1;
  } while( true );
}

Assistant:

static int sqlite3Fts5ExprPopulatePoslists(
  Fts5Config *pConfig,
  Fts5Expr *pExpr, 
  Fts5PoslistPopulator *aPopulator,
  int iCol, 
  const char *z, int n
){
  int i;
  Fts5ExprCtx sCtx;
  sCtx.pExpr = pExpr;
  sCtx.aPopulator = aPopulator;
  sCtx.iOff = (((i64)iCol) << 32) - 1;

  for(i=0; i<pExpr->nPhrase; i++){
    Fts5ExprNode *pNode = pExpr->apExprPhrase[i]->pNode;
    Fts5Colset *pColset = pNode->pNear->pColset;
    if( (pColset && 0==fts5ExprColsetTest(pColset, iCol)) 
     || aPopulator[i].bMiss
    ){
      aPopulator[i].bOk = 0;
    }else{
      aPopulator[i].bOk = 1;
    }
  }

  return sqlite3Fts5Tokenize(pConfig, 
      FTS5_TOKENIZE_DOCUMENT, z, n, (void*)&sCtx, fts5ExprPopulatePoslistsCb
  );
}